

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::handleColorData
          (LibraryEffectsLoader *this,float *data,size_t length,Color *color)

{
  size_t sVar1;
  size_t sVar2;
  double *pdVar3;
  
  if (length != 0) {
    sVar1 = this->mCurrentColorValueIndex;
    sVar2 = 0;
    do {
      pdVar3 = &color->mR;
      switch(sVar1 + sVar2) {
      case 0:
        break;
      case 1:
        pdVar3 = &color->mG;
        break;
      case 2:
        pdVar3 = &color->mB;
        break;
      case 3:
        pdVar3 = &color->mA;
        break;
      default:
        goto switchD_007bd2e1_default;
      }
      *pdVar3 = (double)data[sVar2];
switchD_007bd2e1_default:
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    this->mCurrentColorValueIndex = sVar1 + length;
  }
  return true;
}

Assistant:

bool LibraryEffectsLoader::handleColorData( const float* data, size_t length, COLLADAFW::Color& color )
	{
		for ( size_t i = 0; i < length; ++i)
		{
			switch ( mCurrentColorValueIndex )
			{
			case 0:
				color.setRed(data[i]);
				break;
			case 1:
				color.setGreen(data[i]);
				break;
			case 2:
				color.setBlue(data[i]);
				break;
			case 3:
				color.setAlpha(data[i]);
				break;
			}
			mCurrentColorValueIndex++;
		}
		return true;
	}